

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordCalc.cpp
# Opt level: O0

double CoordAngle(double lat1,double lon1,double lat2,double lon2)

{
  double in_XMM0_Qa;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  undefined4 in_XMM3_Da;
  undefined4 in_XMM3_Db;
  double y;
  double x;
  double longitudeDifference;
  
  dVar1 = (in_XMM0_Qa * 3.141592653589793) / 180.0;
  dVar2 = (in_XMM2_Qa * 3.141592653589793) / 180.0;
  dVar3 = ((double)CONCAT44(in_XMM3_Db,in_XMM3_Da) * 3.141592653589793) / 180.0 -
          (in_XMM1_Qa * 3.141592653589793) / 180.0;
  dVar4 = cos(dVar1);
  dVar5 = sin(dVar2);
  dVar1 = sin(dVar1);
  dVar6 = cos(dVar2);
  dVar7 = cos(dVar3);
  dVar3 = sin(dVar3);
  dVar2 = cos(dVar2);
  dVar1 = atan2(dVar3 * dVar2,dVar4 * dVar5 + -(dVar1 * dVar6 * dVar7));
  dVar1 = rad2deg360(dVar1);
  return dVar1;
}

Assistant:

double CoordAngle (double lat1, double lon1, double lat2, double lon2)
{
    lat1 *= PI; lat1 /= 180.0;              // in-place degree-to-rad conversion
    lon1 *= PI; lon1 /= 180.0;
    lat2 *= PI; lat2 /= 180.0;
    lon2 *= PI; lon2 /= 180.0;
    const double longitudeDifference = lon2 - lon1;
    
    using namespace std;
    const double x = (cos(lat1) * sin(lat2)) -
                     (sin(lat1) * cos(lat2) * cos(longitudeDifference));
    const double y = sin(longitudeDifference) * cos(lat2);
    
    return rad2deg360(atan2(y, x));
}